

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_shader_params_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,UsdPreviewSurface *shader,uint32_t indent)

{
  string *psVar1;
  uint32_t indent_00;
  stringstream ss;
  allocator local_201;
  string local_200;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_1c0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  ::std::__cxx11::string::string((string *)&local_1e0,"inputs:diffuseColor",&local_201);
  indent_00 = (uint32_t)shader;
  print_typed_attr<tinyusdz::value::color3f>
            (&local_200,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
             (this + 0x730),&local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1e0,"inputs:emissiveColor",&local_201);
  print_typed_attr<tinyusdz::value::color3f>
            (&local_200,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
             (this + 0x9c8),&local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1e0,"inputs:useSpecularWorkflow",&local_201);
  print_typed_attr<int>
            (&local_200,(TypedAttributeWithFallback<tinyusdz::Animatable<int>_> *)(this + 0xc60),
             &local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1e0,"inputs:ior",&local_201);
  print_typed_attr<float>
            (&local_200,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x20b0),
             &local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1e0,"inputs:specularColor",&local_201);
  print_typed_attr<tinyusdz::value::color3f>
            (&local_200,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
             (this + 0xee8),&local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1e0,"inputs:metallic",&local_201);
  print_typed_attr<float>
            (&local_200,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1180),
             &local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1e0,"inputs:clearcoat",&local_201);
  print_typed_attr<float>
            (&local_200,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1408),
             &local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1e0,"inputs:clearcoatRoughness",&local_201);
  print_typed_attr<float>
            (&local_200,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1690),
             &local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1e0,"inputs:roughness",&local_201);
  print_typed_attr<float>
            (&local_200,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1918),
             &local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1e0,"inputs:opacity",&local_201);
  print_typed_attr<float>
            (&local_200,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1ba0),
             &local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1e0,"inputs:opacityThreshold",&local_201);
  print_typed_attr<float>
            (&local_200,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1e28),
             &local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1e0,"inputs:normal",&local_201);
  print_typed_attr<tinyusdz::value::normal3f>
            (&local_200,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)
             (this + 0x2338),&local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1e0,"inputs:displacement",&local_201);
  print_typed_attr<float>
            (&local_200,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x25d0),
             &local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1e0,"inputs:occlusion",&local_201);
  print_typed_attr<float>
            (&local_200,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x2858),
             &local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1e0,"outputs:surface",&local_201);
  print_typed_terminal_attr<tinyusdz::Token>
            (&local_200,(TypedTerminalAttribute<tinyusdz::Token> *)(this + 0x2ae0),&local_1e0,
             indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1e0,"outputs:displacement",&local_201);
  print_typed_terminal_attr<tinyusdz::Token>
            (&local_200,(TypedTerminalAttribute<tinyusdz::Token> *)(this + 0x2d10),&local_1e0,
             indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  print_common_shader_params_abi_cxx11_
            (&local_200,this,(ShaderNode *)((ulong)shader & 0xffffffff),indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  psVar1 = local_1c0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return psVar1;
}

Assistant:

static std::string print_shader_params(const UsdPreviewSurface &shader,
                                       const uint32_t indent) {
  std::stringstream ss;

  ss << print_typed_attr(shader.diffuseColor, "inputs:diffuseColor", indent);
  ss << print_typed_attr(shader.emissiveColor, "inputs:emissiveColor", indent);
  ss << print_typed_attr(shader.useSpecularWorkflow,
                         "inputs:useSpecularWorkflow", indent);
  ss << print_typed_attr(shader.ior, "inputs:ior", indent);
  ss << print_typed_attr(shader.specularColor, "inputs:specularColor", indent);
  ss << print_typed_attr(shader.metallic, "inputs:metallic", indent);
  ss << print_typed_attr(shader.clearcoat, "inputs:clearcoat", indent);
  ss << print_typed_attr(shader.clearcoatRoughness, "inputs:clearcoatRoughness",
                         indent);
  ss << print_typed_attr(shader.roughness, "inputs:roughness", indent);
  ss << print_typed_attr(shader.opacity, "inputs:opacity", indent);
  ss << print_typed_attr(shader.opacityThreshold, "inputs:opacityThreshold",
                         indent);
  ss << print_typed_attr(shader.normal, "inputs:normal", indent);
  ss << print_typed_attr(shader.displacement, "inputs:displacement", indent);
  ss << print_typed_attr(shader.occlusion, "inputs:occlusion", indent);

  ss << print_typed_terminal_attr(shader.outputsSurface, "outputs:surface",
                                  indent);
  ss << print_typed_terminal_attr(shader.outputsDisplacement,
                                  "outputs:displacement", indent);

  ss << print_common_shader_params(shader, indent);

  return ss.str();
}